

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void MeCab::enum_csv_dictionaries
               (char *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics)

{
  int iVar1;
  DIR *__dirp;
  ostream *poVar2;
  size_t sVar3;
  dirent *pdVar4;
  ulong uVar5;
  string tmp;
  string ext;
  allocator local_c1;
  string local_c0;
  undefined1 *local_a0;
  ulong local_98;
  undefined1 local_90 [16];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  local_80 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dics;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(dics);
  __dirp = opendir(path);
  if (__dirp == (DIR *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/utils.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xed);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"dir",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"no such directory: ",0x13);
    if (path == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(path);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,path,sVar3);
    }
    die::~die((die *)&local_c0);
  }
  local_78 = path;
  pdVar4 = readdir(__dirp);
  if (pdVar4 != (dirent *)0x0) {
    do {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      sVar3 = strlen(pdVar4->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,pdVar4->d_name,pdVar4->d_name + sVar3);
      if (4 < local_c0._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_c0);
        if (local_98 != 0) {
          uVar5 = 0;
          do {
            if ((byte)(local_a0[uVar5] + 0xbf) < 0x1a) {
              local_a0[uVar5] = local_a0[uVar5] | 0x20;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < local_98);
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_a0);
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)&local_70,local_78,&local_c1);
          create_filename(&local_50,&local_70,&local_c0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_80,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      pdVar4 = readdir(__dirp);
    } while (pdVar4 != (dirent *)0x0);
  }
  closedir(__dirp);
  return;
}

Assistant:

void enum_csv_dictionaries(const char *path,
                           std::vector<std::string> *dics) {
  dics->clear();

#if defined(_WIN32) && !defined(__CYGWIN__)
  WIN32_FIND_DATAW wfd;
  HANDLE hFind;
  const std::wstring pat = Utf8ToWide(create_filename(path, "*.csv"));
  hFind = ::FindFirstFileW(pat.c_str(), &wfd);
  CHECK_DIE(hFind != INVALID_HANDLE_VALUE)
      << "Invalid File Handle. Get Last Error reports";
  do {
    std::string tmp = create_filename(path, WideToUtf8(wfd.cFileName));
    dics->push_back(tmp);
  } while (::FindNextFileW(hFind, &wfd));
  ::FindClose(hFind);
#else
  DIR *dir = opendir(path);
  CHECK_DIE(dir) << "no such directory: " << path;

  for (struct dirent *dp = readdir(dir);
       dp;
       dp = readdir(dir)) {
    const std::string tmp = dp->d_name;
    if (tmp.size() >= 5) {
      std::string ext = tmp.substr(tmp.size() - 4, 4);
      toLower(&ext);
      if (ext == ".csv") {
        dics->push_back(create_filename(path, tmp));
      }
    }
  }
  closedir(dir);
#endif
}